

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScalableKReach.cpp
# Opt level: O3

bool __thiscall
ScalableKReach::PartialIndex::double_intermediate(PartialIndex *this,vertex_t s,vertex_t t)

{
  byte bVar1;
  byte bVar2;
  _Hash_node_base *p_Var3;
  const_iterator cVar4;
  ulong uVar5;
  __node_base *p_Var6;
  __hashtable *__h_1;
  __hashtable *__h;
  
  p_Var3 = (this->succ_)._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      p_Var6 = &(this->succ_)._M_h._M_before_begin;
      while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
        cVar4 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->pred_)._M_h,(key_type *)(p_Var3 + 1));
        if (cVar4.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
LAB_00108ac9:
          std::__throw_out_of_range("_Map_base::at");
LAB_00108ae8:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        if ((ulong)(*(long *)((long)cVar4.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                    ._M_cur + 0x18) -
                   *(long *)((long)cVar4.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                   ._M_cur + 0x10)) <= (ulong)s) goto LAB_00108ae8;
        bVar1 = *(byte *)(*(long *)((long)cVar4.
                                          super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                          ._M_cur + 0x10) + (ulong)s);
        cVar4 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->succ_)._M_h,(key_type *)(p_Var3 + 1));
        if (cVar4.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
            ._M_cur == (__node_type *)0x0) goto LAB_00108ac9;
        uVar5 = (ulong)(uint)*(size_type *)(p_Var6 + 1);
        if ((ulong)(*(long *)((long)cVar4.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                    ._M_cur + 0x18) -
                   *(long *)((long)cVar4.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                   ._M_cur + 0x10)) <= uVar5) goto LAB_00108ae8;
        bVar2 = *(byte *)(*(long *)((long)cVar4.
                                          super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                          ._M_cur + 0x10) + uVar5);
        cVar4 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->succ_)._M_h,(key_type *)(p_Var6 + 1));
        if (cVar4.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
            ._M_cur == (__node_type *)0x0) goto LAB_00108ac9;
        if ((ulong)(*(long *)((long)cVar4.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                    ._M_cur + 0x18) -
                   *(long *)((long)cVar4.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                   ._M_cur + 0x10)) <= (ulong)t) goto LAB_00108ae8;
        if ((uint)*(byte *)(*(long *)((long)cVar4.
                                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                            ._M_cur + 0x10) + (ulong)t) + (uint)bVar2 + (uint)bVar1
            <= (uint)this->k_) {
          return true;
        }
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return false;
}

Assistant:

bool ScalableKReach::PartialIndex::double_intermediate(vertex_t s, vertex_t t) const {
    for (const auto &i : succ_) {
        for (const auto &j : succ_) {
            if (pred_.at(i.first).at(s) + succ_.at(i.first).at(j.first) + succ_.at(j.first).at(t) <= k_) {
                return true;
            }
        }
    }
    return false;
}